

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_conserved_exp_entropy_erk.c
# Opt level: O1

int ans(sunrealtype t,N_Vector y)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = (double *)N_VGetArrayPointer();
  dVar2 = exp(t * 4.367003099159174);
  dVar3 = log(dVar2 + 1.6487212707001282);
  *pdVar1 = 1.9740769841801067 - dVar3;
  dVar3 = exp(t * 4.367003099159174);
  dVar3 = log(dVar3 * 4.367003099159174);
  dVar2 = log(dVar2 + 1.6487212707001282);
  pdVar1[1] = dVar3 - dVar2;
  return 0;
}

Assistant:

int ans(sunrealtype t, N_Vector y)
{
  sunrealtype a, b;
  sunrealtype* ydata = N_VGetArrayPointer(y);

  a = SQRT(EVAL) + EVAL;
  b = SQRT(EVAL) + EXP(a * t);

  ydata[0] = LOG(EVAL + EXP(SUN_RCONST(1.5))) - LOG(b);
  ydata[1] = LOG(a * EXP(a * t)) - LOG(b);

  return 0;
}